

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O2

void destroy_xmlNode_has_attribute_equal_to(Constraint *constraint)

{
  undefined8 *__ptr;
  
  __ptr = (undefined8 *)(constraint->expected_value).value.pointer_value;
  (*_xmlFree)(*__ptr);
  (*_xmlFree)(__ptr[1]);
  free(__ptr);
  destroy_empty_constraint(constraint);
  return;
}

Assistant:

static void destroy_xmlNode_has_attribute_equal_to(Constraint* constraint) {
    struct xmlNode_has_attribute_equal_to *expected =
        (struct xmlNode_has_attribute_equal_to*)constraint->expected_value.value.pointer_value;
    xmlFree(expected->attr);
    xmlFree(expected->value);
    free(expected);
    destroy_empty_constraint(constraint);
}